

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu-aarch64.cpp
# Opt level: O0

void ggml::cpu::aarch64::gemm<block_q4_0,8l,4l,(ggml_type)8>
               (int n,float *s,size_t bs,void *vx,void *vy,int nr,int nc)

{
  int in_stack_0000007c;
  void *in_stack_00000080;
  void *in_stack_00000088;
  size_t in_stack_00000090;
  float *in_stack_00000098;
  int in_stack_000000a4;
  int in_stack_000000b0;
  
  ggml_gemm_q4_0_4x8_q8_0
            (in_stack_000000a4,in_stack_00000098,in_stack_00000090,in_stack_00000088,
             in_stack_00000080,in_stack_0000007c,in_stack_000000b0);
  return;
}

Assistant:

void gemm<block_q4_0, 8, 4, GGML_TYPE_Q8_0>(int n, float * s, size_t bs, const void * vx, const void * vy, int nr, int nc) {
    ggml_gemm_q4_0_4x8_q8_0(n, s, bs, vx, vy, nr, nc);
}